

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_settable(lua_State *L,int idx)

{
  long lVar1;
  TValue *t_00;
  TValue *io2;
  TValue *io1;
  TValue *slot;
  TValue *t;
  int idx_local;
  lua_State *L_local;
  
  t_00 = index2value(L,idx);
  if (t_00->tt_ == 'E') {
    io1 = luaH_get((Table *)(t_00->value_).gc,(TValue *)((L->top).offset + -0x20));
    if ((io1->tt_ & 0xf) != 0) {
      lVar1 = (L->top).offset;
      io1->value_ = *(Value *)(lVar1 + -0x10);
      io1->tt_ = *(lu_byte *)(lVar1 + -8);
      if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) &&
          ((((t_00->value_).gc)->marked & 0x20) != 0)) &&
         ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
        luaC_barrierback_(L,(t_00->value_).gc);
      }
      goto LAB_00108dbd;
    }
  }
  else {
    io1 = (TValue *)0x0;
  }
  luaV_finishset(L,t_00,(TValue *)((L->top).offset + -0x20),(TValue *)((L->top).offset + -0x10),io1)
  ;
LAB_00108dbd:
  (L->top).p = (StkId)((L->top).offset + -0x20);
  return;
}

Assistant:

LUA_API void lua_settable (lua_State *L, int idx) {
  TValue *t;
  const TValue *slot;
  lua_lock(L);
  api_checknelems(L, 2);
  t = index2value(L, idx);
  if (luaV_fastget(L, t, s2v(L->top.p - 2), slot, luaH_get)) {
    luaV_finishfastset(L, t, slot, s2v(L->top.p - 1));
  }
  else
    luaV_finishset(L, t, s2v(L->top.p - 2), s2v(L->top.p - 1), slot);
  L->top.p -= 2;  /* pop index and value */
  lua_unlock(L);
}